

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,local_time_type x,local_time_format_info fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  value_type v;
  undefined1 in_CL;
  uint16_t in_DX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  region *this_00;
  size_t in_R8;
  format_type f;
  region *in_stack_00000008;
  undefined7 uStack_2f;
  
  *in_RDI = 8;
  f._0_8_ = CONCAT71(uStack_2f,in_CL) & 0xffffffff;
  v.nanosecond = in_DX;
  v._0_8_ = in_RSI;
  f.subsecond_precision = in_R8;
  toml::detail::value_with_format<toml::local_time,_toml::local_time_format_info>::value_with_format
            ((value_with_format<toml::local_time,_toml::local_time_format_info> *)(in_RDI + 8),v,f);
  this_00 = (region *)(in_RDI + 0x48);
  toml::detail::region::region(this_00,in_stack_00000008);
  preserve_comments::preserve_comments
            ((preserve_comments *)this_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_00000008);
  return;
}

Assistant:

basic_value(local_time_type x, local_time_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::local_time), local_time_(local_time_storage(x, fmt)),
          region_(std::move(reg)), comments_(std::move(com))
    {}